

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O2

void finish(warm_cb *data)

{
  multi_ex *this;
  pointer ppeVar1;
  uint32_t uVar2;
  ostream *poVar3;
  undefined **ppuVar4;
  size_t a_1;
  long lVar5;
  size_t a;
  ulong uVar6;
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  (*(code *)PTR_delete_label_002b1b58)();
  v_array<ACTION_SCORE::action_score>::delete_v(&data->a_s);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_48,&data->cumulative_costs);
  uVar2 = find_min<float>((vector<float,_std::allocator<float>_> *)&local_48);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  if (data->all->quiet == false) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"average variance estimate = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,data->cumu_var / (float)data->inter_iter);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cerr,"theoretical average variance = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(float)data->num_actions / data->epsilon);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cerr,"last lambda chosen = ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(data->lambdas).super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar2]);
    poVar3 = std::operator<<(poVar3," among lambdas ranging from ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,*(data->lambdas).super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    poVar3 = std::operator<<(poVar3," to ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(data->lambdas).super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start[data->choices_lambda - 1]);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  lVar5 = 0;
  for (uVar6 = 0; uVar6 < data->num_actions; uVar6 = uVar6 + 1) {
    (*(code *)PTR_delete_label_002b1ac8)((long)&(data->csls->costs)._begin + lVar5);
    lVar5 = lVar5 + 0x20;
  }
  free(data->csls);
  free(data->cbls);
  this = &data->ecs;
  for (uVar6 = 0; uVar6 < data->num_actions; uVar6 = uVar6 + 1) {
    v_array<ACTION_SCORE::action_score>::delete_v
              ((v_array<ACTION_SCORE::action_score> *)
               &((this->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar6]->pred).scalars);
    VW::dealloc_example((_func_void_void_ptr *)PTR_delete_label_002b1b58,
                        (this->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar6],(_func_void_void_ptr *)0x0);
    free((this->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
         super__Vector_impl_data._M_start[uVar6]);
  }
  std::_Vector_base<example_*,_std::allocator<example_*>_>::~_Vector_base
            (&this->super__Vector_base<example_*,_std::allocator<example_*>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(data->lambdas).super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(data->cumulative_costs).super__Vector_base<float,_std::allocator<float>_>);
  v_array<ACTION_SCORE::action_score>::delete_v(&data->a_s_adf);
  for (uVar6 = 0;
      ppeVar1 = (data->ws_vali).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(data->ws_vali).
                            super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppeVar1 >> 3);
      uVar6 = uVar6 + 1) {
    ppuVar4 = &MULTICLASS::mc_label;
    if (data->use_cs != false) {
      ppuVar4 = &COST_SENSITIVE::cs_label;
    }
    VW::dealloc_example((_func_void_void_ptr *)ppuVar4[4],ppeVar1[uVar6],(_func_void_void_ptr *)0x0)
    ;
    free((data->ws_vali).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
         super__Vector_impl_data._M_start[uVar6]);
  }
  std::_Vector_base<example_*,_std::allocator<example_*>_>::~_Vector_base
            (&(data->ws_vali).super__Vector_base<example_*,_std::allocator<example_*>_>);
  return;
}

Assistant:

void finish(warm_cb& data)
{
  CB::cb_label.delete_label(&data.cb_label);
  data.a_s.delete_v();

	uint32_t argmin = find_min(data.cumulative_costs);

  if (!data.all->quiet)
  {
  	cerr << "average variance estimate = " << data.cumu_var / data.inter_iter << endl;
  	cerr << "theoretical average variance = " << data.num_actions / data.epsilon << endl;
  	cerr << "last lambda chosen = " << data.lambdas[argmin] << " among lambdas ranging from " << data.lambdas[0] << " to " << data.lambdas[data.choices_lambda-1] << endl;
  }

	for (size_t a = 0; a < data.num_actions; ++a)
	{
		COST_SENSITIVE::cs_label.delete_label(&data.csls[a]);
	}
	free(data.csls);
	free(data.cbls);

  for (size_t a = 0; a < data.num_actions; ++a)
    {
      data.ecs[a]->pred.a_s.delete_v();
      VW::dealloc_example(CB::cb_label.delete_label, *data.ecs[a]);
      free_it(data.ecs[a]);
    }
  data.ecs.~vector<example*>();

	data.lambdas.~vector<float>();
	data.cumulative_costs.~vector<float>();

	data.a_s_adf.delete_v();
	for (size_t i = 0; i < data.ws_vali.size(); ++i)
	{
		if (data.use_cs)
			VW::dealloc_example(COST_SENSITIVE::cs_label.delete_label, *data.ws_vali[i]);
		else
			VW::dealloc_example(MULTICLASS::mc_label.delete_label, *data.ws_vali[i]);
		free(data.ws_vali[i]);
	}
	data.ws_vali.~vector<example*>();
}